

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int64_t test_memory_compare_value(void *memory,uint8_t value,uint64_t size)

{
  ulong uStack_30;
  uint8_t byte;
  uint64_t i;
  uint64_t size_local;
  uint8_t value_local;
  void *memory_local;
  
  uStack_30 = 0;
  while( true ) {
    if (size <= uStack_30) {
      return 0;
    }
    if (*(byte *)((long)memory + uStack_30) != value) break;
    uStack_30 = uStack_30 + 1;
  }
  return (long)(int)((uint)*(byte *)((long)memory + uStack_30) - (uint)value);
}

Assistant:

int64_t test_memory_compare_value(const void *memory,
                                  uint8_t value,
                                  uint64_t size)
{
  for (uint64_t i = 0; i < size; ++i)
  {
    uint8_t byte = (static_cast<const uint8_t *>(memory))[i];
    if (byte != value)
    {
      return byte - value;
    }
  }
  return 0;
}